

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbpl_bfs_2d.h
# Opt level: O1

bool __thiscall sbpl_bfs_2d::compute_distance_from_point(sbpl_bfs_2d *this,int **grid,int x,int y)

{
  sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *psVar1;
  bool bVar2;
  bfs_cell_2d val;
  
  if ((((x < 0) || (y < 0)) || (this->size_x_ <= x)) || (this->size_y_ <= y)) {
    puts("ERROR[compute_distance_from_point]: point is out of bounds!");
    bVar2 = false;
  }
  else {
    psVar1 = this->q_;
    psVar1->head_ = 0;
    psVar1->tail_ = 0;
    clear_distances(this);
    val.y = y;
    val.x = x;
    sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d>::insert(this->q_,val);
    this->dist_[(uint)x][(uint)y] = 0;
    compute_distances(this,grid);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool compute_distance_from_point(int** grid, int x, int y)
    {
        if (x < 0 || x >= size_x_ || y < 0 || y >= size_y_) {
            printf("ERROR[compute_distance_from_point]: point is out of bounds!\n");
            return false;
        }
        q_->clear();
        clear_distances();

        bfs_cell_2d c(x, y);
        q_->insert(c);
        dist_[x][y] = 0;

        compute_distances(grid);
        return true;
    }